

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseNewDoc
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  int iVar1;
  xmlSchemaParserCtxtPtr ctxt;
  char *message;
  xmlChar *in_R8;
  
  if (bucket == (xmlSchemaBucketPtr_conflict)0x0) {
    return 0;
  }
  if (bucket->parsed == 0) {
    if (bucket->doc == (xmlDocPtr)0x0) {
      message = "parsing a schema doc, but there\'s no doc";
    }
    else {
      if (pctxt->constructor != (xmlSchemaConstructionCtxtPtr)0x0) {
        ctxt = xmlSchemaNewParserCtxtUseDict((char *)bucket->schemaLocation,pctxt->dict);
        if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
          return -1;
        }
        ctxt->constructor = pctxt->constructor;
        ctxt->schema = schema;
        xmlSchemaSetParserErrors(ctxt,pctxt->error,pctxt->warning,pctxt->errCtxt);
        xmlSchemaSetParserStructuredErrors(ctxt,pctxt->serror,pctxt->errCtxt);
        ctxt->counter = pctxt->counter;
        iVar1 = xmlSchemaParseNewDocWithContext(ctxt,schema,bucket);
        if (iVar1 != 0) {
          pctxt->err = iVar1;
        }
        pctxt->nberrors = pctxt->nberrors + ctxt->nberrors;
        pctxt->counter = ctxt->counter;
        ctxt->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
        xmlSchemaFreeParserCtxt(ctxt);
        return iVar1;
      }
      message = "no constructor";
    }
  }
  else {
    message = "reparsing a schema doc";
  }
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseNewDoc",message,(xmlChar *)0x0,in_R8);
  return -1;
}

Assistant:

static int
xmlSchemaParseNewDoc(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    xmlSchemaParserCtxtPtr newpctxt;
    int res = 0;

    if (bucket == NULL)
	return(0);
    if (bucket->parsed) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "reparsing a schema doc");
	return(-1);
    }
    if (bucket->doc == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "parsing a schema doc, but there's no doc");
	return(-1);
    }
    if (pctxt->constructor == NULL) {
	PERROR_INT("xmlSchemaParseNewDoc",
	    "no constructor");
	return(-1);
    }
    /* Create and init the temporary parser context. */
    newpctxt = xmlSchemaNewParserCtxtUseDict(
	(const char *) bucket->schemaLocation, pctxt->dict);
    if (newpctxt == NULL)
	return(-1);
    newpctxt->constructor = pctxt->constructor;
    /*
    * TODO: Can we avoid that the parser knows about the main schema?
    * It would be better if he knows about the current schema bucket
    * only.
    */
    newpctxt->schema = schema;
    xmlSchemaSetParserErrors(newpctxt, pctxt->error, pctxt->warning,
	pctxt->errCtxt);
    xmlSchemaSetParserStructuredErrors(newpctxt, pctxt->serror,
	pctxt->errCtxt);
    newpctxt->counter = pctxt->counter;


    res = xmlSchemaParseNewDocWithContext(newpctxt, schema, bucket);

    /* Channel back errors and cleanup the temporary parser context. */
    if (res != 0)
	pctxt->err = res;
    pctxt->nberrors += newpctxt->nberrors;
    pctxt->counter = newpctxt->counter;
    newpctxt->constructor = NULL;
    /* Free the parser context. */
    xmlSchemaFreeParserCtxt(newpctxt);
    return(res);
}